

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O2

bool basisu::write_compressed_texture_file
               (char *pFilename,vector<basisu::vector<basisu::gpu_image>_> *g,bool cubemap_flag)

{
  bool bVar1;
  _Alloc_hider __ptr;
  uint8_vec filedata;
  string extension;
  allocator<char> local_89;
  string local_88;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pFilename,&local_89);
  string_get_extension(&local_88,&local_40);
  string_tolower(&local_60,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_40);
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  bVar1 = std::operator==(&local_60,"ktx");
  if (bVar1) {
    create_ktx_texture_file((uint8_vec *)&local_88,g,cubemap_flag);
    bVar1 = write_vec_to_file(pFilename,(uint8_vec *)&local_88);
    __ptr._M_p = local_88._M_dataplus._M_p;
  }
  else {
    bVar1 = std::operator==(&local_60,"pvr");
    if (!bVar1) {
      bVar1 = std::operator==(&local_60,"dds");
      if (!bVar1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                      ,0x627,
                      "bool basisu::write_compressed_texture_file(const char *, const basisu::vector<gpu_image_vec> &, bool)"
                     );
      }
    }
    __ptr._M_p = (pointer)0x0;
    bVar1 = false;
  }
  free(__ptr._M_p);
  std::__cxx11::string::~string((string *)&local_60);
  return bVar1;
}

Assistant:

bool write_compressed_texture_file(const char* pFilename, const basisu::vector<gpu_image_vec>& g, bool cubemap_flag)
	{
		std::string extension(string_tolower(string_get_extension(pFilename)));

		uint8_vec filedata;
		if (extension == "ktx")
		{
			if (!create_ktx_texture_file(filedata, g, cubemap_flag))
				return false;
		}
		else if (extension == "pvr")
		{
			// TODO
			return false;
		}
		else if (extension == "dds")
		{
			// TODO
			return false;
		}
		else
		{
			// unsupported texture format
			assert(0);
			return false;
		}

		return basisu::write_vec_to_file(pFilename, filedata);
	}